

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

ssize_t writen(int fd,void *buff,size_t n)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t writeSum;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (n == 0) {
      return lVar3;
    }
    while (sVar1 = write(fd,buff,n), sVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        if (*piVar2 == 0xb) {
          return lVar3;
        }
        return -1;
      }
    }
    lVar3 = lVar3 + sVar1;
    n = n - sVar1;
    buff = (void *)((long)buff + sVar1);
  } while( true );
}

Assistant:

ssize_t writen(int fd, void *buff, size_t n) {
  size_t nleft = n;
  ssize_t nwritten = 0;
  ssize_t writeSum = 0;
  char *ptr = (char *)buff;
  while (nleft > 0) {
    if ((nwritten = write(fd, ptr, nleft)) <= 0) {
      if (nwritten < 0) {
        if (errno == EINTR) {
          nwritten = 0;
          continue;
        } else if (errno == EAGAIN) {
          return writeSum;
        } else
          return -1;
      }
    }
    writeSum += nwritten;
    nleft -= nwritten;
    ptr += nwritten;
  }
  return writeSum;
}